

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O0

LinkedObjectFile *
to_linked_object_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name)

{
  int *piVar1;
  LinkedObjectFile *in_RDI;
  LinkHeaderCommon *header;
  LinkedObjectFile *result;
  string *in_stack_00000060;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000068;
  LinkedObjectFile *in_stack_00000070;
  string *in_stack_000000b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000000b8;
  LinkedObjectFile *in_stack_000000c0;
  string *in_stack_000000e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000000e8;
  LinkedObjectFile *in_stack_000000f0;
  size_type in_stack_ffffffffffffffa8;
  LinkedObjectFile *this;
  
  this = in_RDI;
  LinkedObjectFile::LinkedObjectFile(in_RDI);
  piVar1 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                             in_stack_ffffffffffffffa8);
  if ((short)piVar1[2] == 3) {
    if (*piVar1 != 0) {
      __assert_fail("header->type_tag == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x311,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    link_v3(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  }
  else if ((short)piVar1[2] == 4) {
    if (*piVar1 != -1) {
      __assert_fail("header->type_tag == 0xffffffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x314,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    link_v4(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  else {
    if ((short)piVar1[2] != 5) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x319,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    link_v5(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  return in_RDI;
}

Assistant:

LinkedObjectFile to_linked_object_file(const std::vector<uint8_t>& data, const std::string& name) {
  LinkedObjectFile result;
  const auto* header = (const LinkHeaderCommon*)&data.at(0);

  // use appropriate linker
  if (header->version == 3) {
    assert(header->type_tag == 0);
    link_v3(result, data, name);
  } else if (header->version == 4) {
    assert(header->type_tag == 0xffffffff);
    link_v4(result, data, name);
  } else if (header->version == 5) {
    link_v5(result, data, name);
  } else {
    assert(false);
  }

  return result;
}